

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::setForegroundBrush(QGraphicsView *this,QBrush *brush)

{
  QGraphicsViewPrivate *pQVar1;
  QGraphicsViewPrivate *in_RSI;
  QGraphicsViewPrivate *d;
  
  pQVar1 = d_func((QGraphicsView *)0xa3b77c);
  QBrush::operator=(&pQVar1->foregroundBrush,(QBrush *)in_RSI);
  QGraphicsViewPrivate::updateAll(in_RSI);
  return;
}

Assistant:

void QGraphicsView::setForegroundBrush(const QBrush &brush)
{
    Q_D(QGraphicsView);
    d->foregroundBrush = brush;
    d->updateAll();
}